

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

TcParseTableBase * __thiscall google::protobuf::Reflection::CreateTcParseTable(Reflection *this)

{
  ReflectionSchema *pRVar1;
  pointer pFVar2;
  pointer pSVar3;
  bool bVar4;
  bool bVar5;
  undefined2 uVar6;
  bool bVar7;
  undefined3 uVar8;
  float fVar9;
  pointer pFVar10;
  pointer pFVar11;
  bool bVar12;
  bool bVar13;
  uint32_t uVar14;
  Descriptor *pDVar15;
  ulong uVar16;
  TcParseTableBase *pTVar17;
  undefined4 extraout_var;
  TailCallParseFunc p_Var18;
  SkipEntry16 *pSVar19;
  void *pvVar20;
  Nonnull<const_char_*> pcVar21;
  SkipEntryBlock *block;
  pointer pFVar22;
  pointer pSVar23;
  int iVar24;
  const_iterator __end2;
  pointer pFVar25;
  long lVar26;
  uint uVar27;
  const_iterator __begin3;
  pointer pSVar28;
  void *pvVar29;
  const_iterator __end3;
  uint uVar30;
  long lVar31;
  uint uVar32;
  FieldDescriptor *pFVar33;
  int iVar34;
  __normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>_>
  __i;
  pointer pFVar35;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  fields;
  TailCallTableInfo table_info;
  uint16_t local_124;
  uint16_t local_120;
  uint32_t local_11c;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  local_118;
  uint32_t local_f8;
  uint32_t local_f4;
  ulong local_f0;
  undefined1 local_e8 [24];
  uint32_t uStack_d0;
  uint uStack_cc;
  pointer local_c8;
  pointer local_b8;
  int local_b0;
  undefined4 uStack_ac;
  int local_a8;
  undefined4 uStack_a4;
  pointer local_a0;
  uint32_t local_98;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  local_90;
  int local_78;
  undefined4 uStack_74;
  int local_70;
  undefined4 uStack_6c;
  pointer local_68;
  byte local_60;
  LogMessageFatal local_50;
  ClassData *local_40;
  ulong local_38;
  
  local_118.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FieldOptions *)0x0;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::reserve(&local_118,(long)this->descriptor_->field_count_);
  pDVar15 = this->descriptor_;
  if (0 < pDVar15->field_count_) {
    pRVar1 = &this->schema_;
    lVar31 = 0;
    lVar26 = 0;
    do {
      pFVar33 = (FieldDescriptor *)(&pDVar15->fields_->super_SymbolBase + lVar31);
      bVar12 = internal::ReflectionSchema::IsFieldInlined(pRVar1,pFVar33);
      local_e8._0_8_ = pFVar33;
      local_e8._8_4_ = internal::ReflectionSchema::HasBitIndex(pRVar1,pFVar33);
      local_e8._12_4_ = 0x3f800000;
      local_e8._16_5_ = (uint5)bVar12 << 0x10;
      bVar13 = internal::ReflectionSchema::IsSplit(pRVar1,pFVar33);
      local_e8[0x15] = bVar13;
      uVar14 = 0xffffffff;
      if (bVar12) {
        uVar14 = internal::ReflectionSchema::InlinedStringIndex(pRVar1,pFVar33);
      }
      uVar27 = uStack_cc;
      uStack_cc = uStack_cc & 0xffffff00;
      uStack_d0 = uVar14;
      if (local_118.
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_118.
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::FieldOptions>
                  (&local_118,
                   (iterator)
                   local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(FieldOptions *)local_e8);
      }
      else {
        uVar16 = CONCAT44(uVar27,uVar14) & 0xffffff00ffffffff;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->lazy_opt = local_e8._16_2_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->is_string_inlined = (bool)local_e8[0x12];
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->is_implicitly_weak = (bool)local_e8[0x13];
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->use_direct_tcparser_table =
             (bool)local_e8[0x14];
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->should_split = (bool)local_e8[0x15];
        *(undefined2 *)
         &(local_118.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x16 = local_e8._22_2_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->inlined_string_index = (int)uVar16;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->use_micro_string =
             (bool)(char)(uVar16 >> 0x20);
        *(int3 *)&(local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->field_0x1d = (int3)(uVar16 >> 0x28);
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field = (FieldDescriptor *)local_e8._0_8_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->has_bit_index = local_e8._8_4_;
        (local_118.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
         ._M_impl.super__Vector_impl_data._M_finish)->presence_probability = (float)local_e8._12_4_;
        local_118.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_118.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar26 = lVar26 + 1;
      pDVar15 = this->descriptor_;
      lVar31 = lVar31 + 0x58;
    } while (lVar26 < pDVar15->field_count_);
  }
  pFVar11 = local_118.
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pFVar10 = local_118.
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_118.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_118.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar31 = (long)local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = lVar31 >> 5;
    lVar26 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
              (local_118.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_118.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar31 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
                (pFVar10,pFVar11);
    }
    else {
      pFVar35 = pFVar10 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
                (pFVar10,pFVar35);
      for (; pFVar35 != pFVar11; pFVar35 = pFVar35 + 1) {
        pFVar33 = pFVar35->field;
        local_e8._16_8_ = *(undefined8 *)&pFVar35->inlined_string_index;
        local_e8._0_8_ = *(undefined8 *)&pFVar35->has_bit_index;
        local_e8._8_8_ = *(undefined8 *)&pFVar35->lazy_opt;
        pFVar22 = pFVar35;
        pFVar25 = pFVar35;
        if (pFVar33->number_ < (pFVar35[-1].field)->number_) {
          do {
            pFVar22 = pFVar25 + -1;
            bVar12 = pFVar25[-1].is_string_inlined;
            bVar13 = pFVar25[-1].is_implicitly_weak;
            bVar4 = pFVar25[-1].use_direct_tcparser_table;
            bVar5 = pFVar25[-1].should_split;
            uVar6 = *(undefined2 *)&pFVar25[-1].field_0x16;
            iVar24 = pFVar25[-1].inlined_string_index;
            bVar7 = pFVar25[-1].use_micro_string;
            uVar8 = *(undefined3 *)&pFVar25[-1].field_0x1d;
            pFVar25->lazy_opt = pFVar25[-1].lazy_opt;
            pFVar25->is_string_inlined = bVar12;
            pFVar25->is_implicitly_weak = bVar13;
            pFVar25->use_direct_tcparser_table = bVar4;
            pFVar25->should_split = bVar5;
            *(undefined2 *)&pFVar25->field_0x16 = uVar6;
            pFVar25->inlined_string_index = iVar24;
            pFVar25->use_micro_string = bVar7;
            *(undefined3 *)&pFVar25->field_0x1d = uVar8;
            iVar24 = pFVar25[-1].has_bit_index;
            fVar9 = pFVar25[-1].presence_probability;
            pFVar25->field = pFVar25[-1].field;
            pFVar25->has_bit_index = iVar24;
            pFVar25->presence_probability = fVar9;
            pFVar2 = pFVar25 + -2;
            pFVar25 = pFVar22;
          } while (pFVar33->number_ < pFVar2->field->number_);
        }
        pFVar22->field = pFVar33;
        *(undefined8 *)&pFVar22->has_bit_index = local_e8._0_8_;
        *(undefined8 *)&pFVar22->lazy_opt = local_e8._8_8_;
        *(undefined8 *)&pFVar22->inlined_string_index = local_e8._16_8_;
      }
    }
  }
  local_50.super_LogMessage.errno_saver_.saved_errno_._0_1_ = false;
  local_50.super_LogMessage.errno_saver_.saved_errno_._1_1_ = false;
  ordered_fields.len_ =
       (long)local_118.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_118.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  ordered_fields.ptr_ =
       local_118.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
       ._M_impl.super__Vector_impl_data._M_start;
  internal::TailCallTableInfo::TailCallTableInfo
            ((TailCallTableInfo *)local_e8,this->descriptor_,(MessageOptions *)&local_50,
             ordered_fields);
  lVar26 = (long)(local_e8._16_8_ - local_e8._8_8_) >> 5;
  iVar24 = 1 << (local_60 & 0x1f);
  iVar34 = (int)lVar26;
  if (iVar24 == iVar34) {
    uVar27 = iVar34 * 0x10 + 0x39U & 0xfff8;
    if (local_90.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_90.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar24 = 4;
    }
    else {
      iVar24 = 2;
      pSVar23 = local_90.
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar24 = iVar24 + ((uint)((ulong)((long)(pSVar23->entries).
                                                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pSVar23->entries).
                                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1) &
                          0xfffffffe) + 3;
        pSVar23 = pSVar23 + 1;
      } while (pSVar23 !=
               local_90.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      iVar24 = iVar24 * 2;
    }
    uVar30 = iVar24 + uVar27 + 2 & 0xfffffffc;
    uVar32 = uVar30 + (int)((ulong)((long)local_118.
                                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_118.
                                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) * 0xc + 7
             & 0xfffffff8;
    uVar16 = (ulong)(int)((int)((ulong)(CONCAT44(uStack_a4,local_a8) - CONCAT44(uStack_ac,local_b0))
                               >> 1) + (local_70 - local_78) + uVar32);
    pTVar17 = (TcParseTableBase *)operator_new(uVar16);
    pRVar1 = &this->schema_;
    local_f4 = uVar32;
    local_f0 = uVar16;
    local_38 = (ulong)uVar30;
    if ((this->schema_).has_bits_offset_ == -1) {
      local_120 = 0;
    }
    else {
      uVar14 = internal::ReflectionSchema::HasBitsOffset(pRVar1);
      local_120 = (uint16_t)uVar14;
    }
    local_11c = 0;
    if ((this->schema_).extensions_offset_ == -1) {
      local_124 = 0;
    }
    else {
      uVar14 = internal::ReflectionSchema::GetExtensionSetOffset(pRVar1);
      local_124 = (uint16_t)uVar14;
    }
    pFVar11 = local_118.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pFVar10 = local_118.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_118.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_118.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_11c = (local_118.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].field)->number_;
    }
    local_f8 = local_98;
    uVar30 = local_a8 - local_b0;
    iVar24 = (*(pRVar1->default_instance_->super_MessageLite)._vptr_MessageLite[4])();
    local_40 = (ClassData *)CONCAT44(extraout_var,iVar24);
    p_Var18 = GetFastParseFunction(local_e8[0]);
    pTVar17->has_bits_offset = local_120;
    pTVar17->extension_offset = local_124;
    pTVar17->max_field_number = local_11c;
    pTVar17->fast_idx_mask = (char)lVar26 * '\b' + 0xf8;
    pTVar17->field_0x9 = pTVar17->field_0x9 & 0xfe;
    pTVar17->lookup_table_offset = (uint16_t)uVar27;
    pTVar17->skipmap32 = local_f8;
    pTVar17->field_entries_offset = (uint32_t)local_38;
    pTVar17->num_field_entries = (uint16_t)((uint)((int)pFVar11 - (int)pFVar10) >> 5);
    pTVar17->num_aux_entries = (uint16_t)(uVar30 >> 4);
    pTVar17->aux_offset = local_f4;
    pTVar17->class_data = local_40;
    pTVar17->post_loop_handler = (PostLoopHandler)0x0;
    pTVar17->fallback = p_Var18;
    PopulateTcParseFastEntries(this,(TailCallTableInfo *)local_e8,(FastFieldEntry *)(pTVar17 + 1));
    pSVar19 = (SkipEntry16 *)((long)&pTVar17->has_bits_offset + (ulong)pTVar17->lookup_table_offset)
    ;
    for (; local_90.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_90.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_90.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_90.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      uVar6 = *(undefined2 *)
               ((long)&(local_90.
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first_fnum + 2);
      pSVar19->skipmap =
           *(undefined2 *)
            &(local_90.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
              ._M_impl.super__Vector_impl_data._M_start)->first_fnum;
      pSVar19->field_entry_offset = uVar6;
      pSVar28 = ((local_90.
                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start)->entries).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = ((local_90.
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                 ._M_impl.super__Vector_impl_data._M_start)->entries).
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar19[1].skipmap = (uint16_t)((uint)((int)pSVar3 - (int)pSVar28) >> 2);
      pSVar19 = (SkipEntry16 *)&pSVar19[1].field_entry_offset;
      for (; pSVar3 != pSVar28; pSVar28 = pSVar28 + 1) {
        *pSVar19 = *pSVar28;
        pSVar19 = pSVar19 + 1;
      }
    }
    pSVar19->skipmap = 0xffff;
    pSVar19->field_entry_offset = 0xffff;
    PopulateTcParseEntries
              (this,(TailCallTableInfo *)local_e8,
               (FieldEntry *)
               ((long)&pTVar17->has_bits_offset + (ulong)pTVar17->field_entries_offset));
    PopulateTcParseFieldAux
              (this,(TailCallTableInfo *)local_e8,
               (FieldAux *)((long)&pTVar17->has_bits_offset + (ulong)pTVar17->aux_offset));
    pvVar20 = (void *)CONCAT44(uStack_74,local_78);
    pvVar29 = pvVar20;
    if (pvVar20 != (void *)CONCAT44(uStack_6c,local_70)) {
      memcpy((void *)((long)&pTVar17->has_bits_offset +
                     (ulong)pTVar17->num_aux_entries * 8 + (ulong)pTVar17->aux_offset),pvVar20,
             (long)CONCAT44(uStack_6c,local_70) - (long)pvVar20);
      pvVar20 = (void *)CONCAT44(uStack_6c,local_70);
      pvVar29 = (void *)CONCAT44(uStack_74,local_78);
    }
    uVar16 = (long)pvVar20 +
             (((ulong)pTVar17->aux_offset + (ulong)pTVar17->num_aux_entries * 8) - (long)pvVar29);
    if (uVar16 == local_f0) {
      if (pvVar29 != (void *)0x0) {
        operator_delete(pvVar29,(long)local_68 - (long)pvVar29);
      }
      std::
      vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
      ::~vector(&local_90);
      pvVar20 = (void *)CONCAT44(uStack_ac,local_b0);
      if (pvVar20 != (void *)0x0) {
        operator_delete(pvVar20,(long)local_a0 - (long)pvVar20);
      }
      if (local_c8 != (pointer)0x0) {
        operator_delete(local_c8,(long)local_b8 - (long)local_c8);
      }
      if ((pointer)local_e8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8._8_8_,CONCAT44(uStack_cc,uStack_d0) - local_e8._8_8_);
      }
      if (local_118.
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return pTVar17;
    }
    pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        (uVar16,local_f0,
                         "res->name_data() + table_info.field_name_data.size() - reinterpret_cast<char*>(res) == byte_size"
                        );
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe82,pcVar21);
  }
  else {
    pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((long)(int)((ulong)(local_e8._16_8_ - local_e8._8_8_) >> 5),(long)iVar24,
                         "static_cast<int>(fast_entries_count) == 1 << table_info.table_size_log2");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe44,pcVar21);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_50);
}

Assistant:

const internal::TcParseTableBase* Reflection::CreateTcParseTable() const {
  using TcParseTableBase = internal::TcParseTableBase;

  constexpr int kNoHasbit = -1;
  std::vector<internal::TailCallTableInfo::FieldOptions> fields;
  fields.reserve(descriptor_->field_count());
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    auto* field = descriptor_->field(i);
    const bool is_inlined = IsInlined(field);
    fields.push_back({
        field,  //
        static_cast<int>(schema_.HasBitIndex(field)),
        1.f,  // All fields are assumed present.
        GetLazyStyle(field),
        is_inlined,
        // Only LITE can be implicitly weak.
        /* is_implicitly_weak */ false,
        // We could change this to use direct table.
        // Might be easier to do when all messages support TDP.
        /* use_direct_tcparser_table */ false,
        schema_.IsSplit(field),
        is_inlined ? static_cast<int>(schema_.InlinedStringIndex(field))
                   : kNoHasbit,
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
            IsMicroString(field),
    });
  }
  std::sort(fields.begin(), fields.end(), [](const auto& a, const auto& b) {
    return a.field->number() < b.field->number();
  });

  internal::TailCallTableInfo table_info(
      descriptor_,
      {
          /* is_lite */ false,
          /* uses_codegen */ false,
      },
      fields);

  const size_t fast_entries_count = table_info.fast_path_fields.size();
  ABSL_CHECK_EQ(static_cast<int>(fast_entries_count),
                1 << table_info.table_size_log2);
  const uint16_t lookup_table_offset = AlignTo<uint16_t>(
      sizeof(TcParseTableBase) +
      fast_entries_count * sizeof(TcParseTableBase::FastFieldEntry));
  const uint32_t field_entry_offset = AlignTo<TcParseTableBase::FieldEntry>(
      lookup_table_offset +
      sizeof(uint16_t) * table_info.num_to_entry_table.size16());
  const uint32_t aux_offset = AlignTo<TcParseTableBase::FieldAux>(
      field_entry_offset +
      sizeof(TcParseTableBase::FieldEntry) * fields.size());

  int byte_size =
      aux_offset +
      sizeof(TcParseTableBase::FieldAux) * table_info.aux_entries.size() +
      sizeof(char) * table_info.field_name_data.size();

  void* p = ::operator new(byte_size);
  auto* res = ::new (p) TcParseTableBase{
      static_cast<uint16_t>(schema_.HasHasbits() ? schema_.HasBitsOffset() : 0),
      schema_.HasExtensionSet()
          ? static_cast<uint16_t>(schema_.GetExtensionSetOffset())
          : uint16_t{0},
      static_cast<uint32_t>(fields.empty() ? 0 : fields.back().field->number()),
      static_cast<uint8_t>((fast_entries_count - 1) << 3),
      lookup_table_offset,
      table_info.num_to_entry_table.skipmap32,
      field_entry_offset,
      static_cast<uint16_t>(fields.size()),
      static_cast<uint16_t>(table_info.aux_entries.size()),
      aux_offset,
      schema_.default_instance_->GetClassData(),
      nullptr,
      GetFastParseFunction(table_info.fallback_function)
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          ,
      nullptr
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
  };
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
  // We'll prefetch `to_prefetch->to_prefetch` unconditionally to avoid
  // branches. Here we don't know which field is the hottest, so set the pointer
  // to itself to avoid nullptr.
  res->to_prefetch = res;
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE

  // Now copy the rest of the payloads
  PopulateTcParseFastEntries(table_info, res->fast_entry(0));

  PopulateTcParseLookupTable(table_info, res->field_lookup_begin());

  PopulateTcParseEntries(table_info, res->field_entries_begin());

  PopulateTcParseFieldAux(table_info, res->field_aux(0u));

  // Copy the name data.
  if (!table_info.field_name_data.empty()) {
    memcpy(res->name_data(), table_info.field_name_data.data(),
           table_info.field_name_data.size());
  }
  // Validation to make sure we used all the bytes correctly.
  ABSL_CHECK_EQ(res->name_data() + table_info.field_name_data.size() -
                    reinterpret_cast<char*>(res),
                byte_size);

  return res;
}